

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zone.cpp
# Opt level: O3

Error __thiscall
asmjit::ZoneVectorBase::_resize(ZoneVectorBase *this,ZoneHeap *heap,size_t sizeOfT,size_t n)

{
  uint8_t **ppuVar1;
  ulong *puVar2;
  Zone *pZVar3;
  Block *pBVar4;
  char cVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  Error EVar8;
  ZoneHeap *pZVar9;
  ZoneHeap *pZVar10;
  ZoneHeap *extraout_RAX;
  Slot *pSVar11;
  sbyte sVar12;
  sbyte sVar13;
  ZoneHeap *pZVar14;
  Slot *pSVar15;
  Block *pBVar16;
  ZoneHeap *extraout_RDX;
  size_t extraout_RDX_00;
  size_t extraout_RDX_01;
  size_t size;
  Slot *pSVar17;
  size_t extraout_RDX_02;
  ulong extraout_RDX_03;
  ZoneHeap *extraout_RDX_04;
  long extraout_RDX_05;
  Block *pBVar18;
  long extraout_RDX_06;
  ZoneHeap *pZVar19;
  uint uVar20;
  ZoneHeap *this_00;
  ZoneHeap *pZVar21;
  ZoneHeap *pZVar22;
  ulong in_R8;
  ulong uVar23;
  undefined1 *puVar24;
  undefined1 *puVar25;
  ulong uVar26;
  uint uVar27;
  long lVar28;
  long lVar29;
  ulong uVar30;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  size_t sStack_d8;
  ZoneHeap *pZStack_d0;
  ZoneHeap *pZStack_c8;
  ZoneHeap *pZStack_c0;
  ZoneHeap *pZStack_b0;
  size_t asStack_a8 [2];
  ZoneHeap *pZStack_98;
  ZoneHeap *pZStack_90;
  ZoneHeap *pZStack_88;
  undefined8 uStack_80;
  ulong uStack_78;
  uint uStack_6c;
  ZoneHeap *pZStack_68;
  ZoneHeap *pZStack_60;
  size_t sStack_58;
  ZoneHeap *pZStack_50;
  
  pZVar21 = (ZoneHeap *)this->_length;
  if (n <= this->_capacity) {
LAB_00118ab5:
    if (pZVar21 <= n && n - (long)pZVar21 != 0) {
      memset((void *)((long)pZVar21 * sizeOfT + (long)this->_data),0,(n - (long)pZVar21) * sizeOfT);
    }
    this->_length = n;
    return 0;
  }
  pZVar14 = (ZoneHeap *)(n - (long)pZVar21);
  pZVar22 = (ZoneHeap *)this;
  EVar8 = _grow(this,heap,sizeOfT,(size_t)pZVar14);
  if (EVar8 != 0) {
    return EVar8;
  }
  if (n <= this->_capacity) goto LAB_00118ab5;
  _resize();
  sStack_58 = n;
  pZStack_50 = pZVar21;
  if (pZVar14 < extraout_RDX) {
    uStack_78 = 0x118de0;
    ZoneBitVector::_resize();
    return 1;
  }
  pZVar19 = (ZoneHeap *)pZVar22->_slots[0];
  if (extraout_RDX <= pZVar19) {
    if (((ulong)extraout_RDX & 0x3f) != 0) {
      ppuVar1 = &pZVar22->_zone->_ptr + ((ulong)extraout_RDX >> 6);
      *ppuVar1 = (uint8_t *)((ulong)*ppuVar1 & ~(-1L << (sbyte)((ulong)extraout_RDX & 0x3f)));
    }
    goto LAB_00118dc6;
  }
  pZVar10 = (ZoneHeap *)pZVar22->_zone;
  if (extraout_RDX <= (ZoneHeap *)pZVar22->_slots[1]) {
LAB_00118c93:
    pZVar14 = (ZoneHeap *)((ulong)pZVar19 >> 6);
    uVar27 = (uint)extraout_RDX & 0x3f;
    sVar12 = (sbyte)uVar27;
    pSVar17 = (Slot *)-(in_R8 & 0xff);
    pZVar19 = (ZoneHeap *)((ulong)pZVar19 & 0x3f);
    if (pZVar19 != (ZoneHeap *)0x0) {
      this_00 = (ZoneHeap *)((ulong)extraout_RDX >> 6);
      sVar13 = 0;
      if ((pZVar14 == this_00) && (sVar13 = sVar12, uVar27 <= (uint)pZVar19)) {
        uStack_78 = 0x118df9;
        ZoneBitVector::_resize();
LAB_00118df9:
        uStack_78 = 0x118dfe;
        ZoneBitVector::_resize();
        goto LAB_00118dfe;
      }
      pZVar10->_slots[(long)((long)&pZVar14[-1]._dynamicBlocks + 7)] =
           (Slot *)((ulong)pZVar10->_slots[(long)((long)&pZVar14[-1]._dynamicBlocks + 7)] |
                   (long)pSVar17 << (sVar13 - (char)pZVar19 & 0x3fU));
      pZVar14 = (ZoneHeap *)((long)&pZVar14->_zone + 1);
    }
    auVar7 = _DAT_00132b70;
    auVar6 = _DAT_00132b60;
    uVar23 = (ulong)(extraout_RDX->_slots + 7) >> 6;
    lVar28 = uVar23 - 1;
    uVar26 = (ulong)((ZoneHeap *)(lVar28 * 0x40) == extraout_RDX);
    pZVar21 = (ZoneHeap *)(lVar28 - uVar26);
    if (pZVar14 <= pZVar21) {
      puVar24 = (undefined1 *)(uVar23 - uVar26);
      puVar25 = (undefined1 *)((long)&pZVar14->_zone + 1);
      if (puVar24 <= puVar25) {
        puVar24 = puVar25;
      }
      puVar25 = puVar24 + (-1 - (long)pZVar14);
      auVar31._8_4_ = (int)puVar25;
      auVar31._0_8_ = puVar25;
      auVar31._12_4_ = (int)((ulong)puVar25 >> 0x20);
      uVar26 = 0;
      auVar31 = auVar31 ^ _DAT_00132b70;
      do {
        auVar33._8_4_ = (int)uVar26;
        auVar33._0_8_ = uVar26;
        auVar33._12_4_ = (int)(uVar26 >> 0x20);
        auVar33 = (auVar33 | auVar6) ^ auVar7;
        if ((bool)(~(auVar33._4_4_ == auVar31._4_4_ && auVar31._0_4_ < auVar33._0_4_ ||
                    auVar31._4_4_ < auVar33._4_4_) & 1)) {
          pZVar10->_slots[(long)pZVar14->_slots + (uVar26 - 9)] = pSVar17;
        }
        if ((auVar33._12_4_ != auVar31._12_4_ || auVar33._8_4_ <= auVar31._8_4_) &&
            auVar33._12_4_ <= auVar31._12_4_) {
          pZVar10->_slots[(long)pZVar14->_slots + (uVar26 - 8)] = pSVar17;
        }
        uVar26 = uVar26 + 2;
      } while (((ulong)(puVar24 + (1 - (long)pZVar14)) & 0xfffffffffffffffe) != uVar26);
    }
    if (((ulong)extraout_RDX & 0x3f) != 0) {
      puVar2 = (ulong *)((long)pZVar10 + (long)pZVar21 * 8);
      *puVar2 = *puVar2 & ~(-1L << sVar12);
    }
LAB_00118dc6:
    pZVar22->_slots[0] = (Slot *)extraout_RDX;
    return 0;
  }
  sizeOfT = (ulong)((long)pZVar14->_slots + 0x37) & 0xffffffffffffffc0;
  if (sizeOfT < extraout_RDX) {
    return 1;
  }
  if (heap->_zone == (Zone *)0x0) {
    uStack_78 = 0x118dec;
    pZVar14 = pZVar22;
    ZoneBitVector::_resize();
    pZVar9 = extraout_RAX;
    size = extraout_RDX_02;
LAB_00118dec:
    this_00 = (ZoneHeap *)sizeOfT;
  }
  else {
    uStack_6c = (uint)in_R8;
    uStack_78 = 0x118b75;
    pZVar14 = heap;
    pZVar9 = (ZoneHeap *)ZoneHeap::_alloc(heap,sizeOfT >> 3,(size_t *)&pZStack_60);
    in_R8 = (ulong)uStack_6c;
    if (pZVar9 == (ZoneHeap *)0x0) {
      return 1;
    }
    size = extraout_RDX_00;
    this_00 = (ZoneHeap *)((long)pZStack_60 * 8);
    if ((ZoneHeap *)((long)pZStack_60 * 8) < pZStack_60) goto LAB_00118dec;
  }
  if (pZVar19 != (ZoneHeap *)0x0) {
    uStack_78 = 0x118bbc;
    pZVar14 = pZVar9;
    pZStack_68 = this_00;
    memcpy(pZVar9,pZVar10,((ulong)(pZVar19->_slots + 7) >> 6) - 1);
    in_R8 = (ulong)uStack_6c;
    size = extraout_RDX_01;
    this_00 = pZStack_68;
    sizeOfT = (size_t)pZVar9;
  }
  pZVar21 = heap;
  if (pZVar10 == (ZoneHeap *)0x0) {
LAB_00118c8c:
    pZVar22->_zone = (Zone *)pZVar9;
    pZVar22->_slots[1] = (Slot *)this_00;
    pZVar10 = pZVar9;
    goto LAB_00118c93;
  }
  if (heap->_zone == (Zone *)0x0) goto LAB_00118df9;
  pSVar17 = pZVar22->_slots[1];
  if ((Slot *)0x7 < pSVar17) {
    if (pSVar17 < (Slot *)0x1008) {
      if (pSVar17 < (Slot *)0x408) {
        uVar27 = (uint)(((ulong)pSVar17 >> 3) + 0x1fffffffff >> 5);
      }
      else {
        uVar27 = (int)(((ulong)pSVar17 >> 3) + 0x3fffffff7f >> 6) + 4;
      }
      pZVar10->_zone = (Zone *)heap->_slots[uVar27];
      heap->_slots[uVar27] = (Slot *)pZVar10;
    }
    else {
      uStack_78 = 0x118c5a;
      ZoneHeap::_releaseDynamic(heap,pZVar10,size);
      in_R8 = (ulong)uStack_6c;
      pZVar21 = this_00;
      sizeOfT = (size_t)pZVar9;
    }
    goto LAB_00118c8c;
  }
LAB_00118dfe:
  uStack_78 = 0x118e03;
  ZoneBitVector::_resize();
  pSVar11 = pZVar14->_slots[1];
  pSVar17 = (Slot *)0x80;
  if ((Slot *)0x7f < pSVar11) {
    if (pSVar11 < (Slot *)0x4000001) {
      pSVar17 = (Slot *)((long)pSVar11 * 2);
    }
    else {
      pSVar17 = pSVar11 + 0x800000;
    }
  }
  pSVar15 = (Slot *)((long)&pZVar14->_slots[0]->next + 1);
  if ((pSVar11 <= pSVar17) || (pSVar17 = pSVar15, pSVar11 < pSVar15)) {
    EVar8 = ZoneBitVector::_resize
                      ((ZoneBitVector *)pZVar14,this_00,(size_t)pSVar15,(size_t)pSVar17,
                       SUB81(extraout_RDX_03 & 0xffffffff,0));
    return EVar8;
  }
  uStack_80 = 0x118e51;
  uStack_78 = extraout_RDX_03 & 0xffffffff;
  ZoneBitVector::_append();
  if (extraout_RDX_04 <= this_00) {
    return (uint)(extraout_RDX_04 < this_00) + (uint)(extraout_RDX_04 < this_00) * 2;
  }
  if ((ZoneHeap *)pZVar14->_slots[0] < this_00) {
    pZStack_88 = (ZoneHeap *)0x118fdd;
    ZoneBitVector::fill();
LAB_00118fdd:
    pZStack_88 = (ZoneHeap *)0x118fe2;
    ZoneBitVector::fill();
LAB_00118fe2:
    pZStack_88 = (ZoneHeap *)0x118fe7;
    ZoneBitVector::fill();
  }
  else {
    if ((ZoneHeap *)pZVar14->_slots[0] < extraout_RDX_04) goto LAB_00118fdd;
    pZVar14 = (ZoneHeap *)pZVar14->_zone;
    if (pZVar14 == (ZoneHeap *)0x0) goto LAB_00118fe2;
    cVar5 = (char)pSVar15;
    uVar26 = (ulong)this_00 >> 6;
    uVar20 = (uint)this_00 & 0x3f;
    this_00 = (ZoneHeap *)(ulong)uVar20;
    uVar23 = (ulong)extraout_RDX_04 >> 6;
    uVar27 = (uint)extraout_RDX_04 & 0x3f;
    sVar12 = (sbyte)uVar27;
    if (this_00 == (ZoneHeap *)0x0) {
LAB_00118ef0:
      auVar7 = _DAT_00132b70;
      auVar6 = _DAT_00132b60;
      lVar28 = uVar23 - uVar26;
      if (uVar26 <= uVar23 && lVar28 != 0) {
        lVar29 = lVar28 + -1;
        auVar32._8_4_ = (int)lVar29;
        auVar32._0_8_ = lVar29;
        auVar32._12_4_ = (int)((ulong)lVar29 >> 0x20);
        uVar30 = 0;
        auVar32 = auVar32 ^ _DAT_00132b70;
        do {
          auVar34._8_4_ = (int)uVar30;
          auVar34._0_8_ = uVar30;
          auVar34._12_4_ = (int)(uVar30 >> 0x20);
          auVar31 = (auVar34 | auVar6) ^ auVar7;
          if ((bool)(~(auVar31._4_4_ == auVar32._4_4_ && auVar32._0_4_ < auVar31._0_4_ ||
                      auVar32._4_4_ < auVar31._4_4_) & 1)) {
            pZVar14->_slots[uVar26 + (uVar30 - 1)] = (Slot *)-((ulong)pSVar15 & 0xff);
          }
          if ((auVar31._12_4_ != auVar32._12_4_ || auVar31._8_4_ <= auVar32._8_4_) &&
              auVar31._12_4_ <= auVar32._12_4_) {
            pZVar14->_slots[uVar26 + uVar30] = (Slot *)-((ulong)pSVar15 & 0xff);
          }
          uVar30 = uVar30 + 2;
        } while ((lVar28 + 1U & 0xfffffffffffffffe) != uVar30);
      }
      if (((ulong)extraout_RDX_04 & 0x3f) != 0) {
        uVar26 = -1L << sVar12;
        if (cVar5 == '\0') {
          pZVar14->_slots[uVar23 - 1] = (Slot *)((ulong)pZVar14->_slots[uVar23 - 1] & uVar26);
        }
        else {
          pZVar14->_slots[uVar23 - 1] = (Slot *)((ulong)pZVar14->_slots[uVar23 - 1] | ~uVar26);
        }
      }
      return 0;
    }
    sVar13 = (sbyte)uVar20;
    if (uVar26 != uVar23) {
      if (cVar5 == '\0') {
        pZVar14->_slots[uVar26 - 1] =
             (Slot *)((ulong)pZVar14->_slots[uVar26 - 1] & ~(-1L << sVar13));
      }
      else {
        pZVar14->_slots[uVar26 - 1] = (Slot *)((ulong)pZVar14->_slots[uVar26 - 1] | -1L << sVar13);
      }
      uVar26 = uVar26 + 1;
      goto LAB_00118ef0;
    }
    if (uVar20 < uVar27) {
      uVar23 = ~(-1L << (sVar12 - sVar13 & 0x3fU)) << sVar13;
      if (cVar5 == '\0') {
        pZVar14->_slots[uVar26 - 1] = (Slot *)((ulong)pZVar14->_slots[uVar26 - 1] & ~uVar23);
      }
      else {
        pZVar14->_slots[uVar26 - 1] = (Slot *)((ulong)pZVar14->_slots[uVar26 - 1] | uVar23);
      }
      return 0;
    }
  }
  pZStack_88 = (ZoneHeap *)ZoneStackBase::_init;
  ZoneBitVector::fill();
  pZVar3 = pZVar14->_zone;
  pZStack_98 = pZVar22;
  pZStack_90 = (ZoneHeap *)sizeOfT;
  pZStack_88 = pZVar19;
  if (pZVar3 != (Zone *)0x0) {
    if ((Block *)pZVar14->_slots[0] != (Block *)0x0) {
      if (pZVar3->_ptr == (uint8_t *)0x0) {
        pZStack_b0 = (ZoneHeap *)0x119097;
        pZVar10 = this_00;
        pZVar9 = pZVar14;
        ZoneStackBase::_init();
        pZVar22 = (ZoneHeap *)pZVar9->_zone;
        pZStack_d0 = pZVar14;
        pZStack_c8 = pZVar21;
        pZStack_c0 = this_00;
        pZStack_b0 = pZVar19;
        if (pZVar22 == (ZoneHeap *)0x0) {
          ZoneStackBase::_prepareBlock();
        }
        else {
          uVar26 = (ulong)pZVar10 & 0xffffffff;
          pSVar17 = pZVar9->_slots[uVar26];
          if (pSVar17[2].next != pSVar17[3].next) {
            if (pZVar22->_zone != (Zone *)0x0) {
              pSVar11 = (Slot *)ZoneHeap::_alloc(pZVar22,0x200,&sStack_d8);
              if (pSVar11 == (Slot *)0x0) {
                return 1;
              }
              pSVar11[uVar26].next = (Slot *)0x0;
              pSVar11[(int)pZVar10 == 0].next = pSVar17;
              pSVar15 = (Slot *)((long)&pSVar11->next + extraout_RDX_06);
              pSVar11[2].next = pSVar15;
              pSVar11[3].next = pSVar15;
              pSVar17[uVar26].next = pSVar11;
              pZVar9->_slots[uVar26] = pSVar11;
              return 0;
            }
            goto LAB_00119122;
          }
        }
        ZoneStackBase::_prepareBlock();
LAB_00119122:
        ZoneStackBase::_prepareBlock();
        return 1;
      }
      pBVar4 = (Block *)pZVar14->_slots[0];
      pBVar18 = pZVar3[2]._block;
      do {
        pBVar16 = pBVar4;
        pBVar4 = pBVar16->next;
        pBVar16->prev = pBVar18;
        pZVar3[2]._block = pBVar16;
        pBVar18 = pBVar16;
      } while (pBVar4 != (Block *)0x0);
    }
    pZVar14->_zone = (Zone *)0x0;
    pZVar14->_slots[0] = (Slot *)0x0;
    pZVar14->_slots[1] = (Slot *)0x0;
  }
  EVar8 = 0;
  if (this_00 != (ZoneHeap *)0x0) {
    if (this_00->_zone == (Zone *)0x0) {
      pZStack_b0 = (ZoneHeap *)0x11908b;
      ZoneStackBase::_init();
    }
    else {
      pZStack_b0 = (ZoneHeap *)0x119058;
      pSVar17 = (Slot *)ZoneHeap::_alloc(this_00,0x200,asStack_a8);
      if (pSVar17 != (Slot *)0x0) {
        pSVar11 = (Slot *)((long)&pSVar17->next + extraout_RDX_05);
        pSVar17->next = (Slot *)0x0;
        pSVar17[1].next = (Slot *)0x0;
        pSVar17[2].next = pSVar11;
        pSVar17[3].next = pSVar11;
        pZVar14->_zone = (Zone *)this_00;
        pZVar14->_slots[0] = pSVar17;
        pZVar14->_slots[1] = pSVar17;
        return 0;
      }
    }
    EVar8 = 1;
  }
  return EVar8;
}

Assistant:

Error ZoneVectorBase::_resize(ZoneHeap* heap, size_t sizeOfT, size_t n) noexcept {
  size_t length = _length;
  if (_capacity < n) {
    ASMJIT_PROPAGATE(_grow(heap, sizeOfT, n - length));
    ASMJIT_ASSERT(_capacity >= n);
  }

  if (length < n)
    ::memset(static_cast<uint8_t*>(_data) + length * sizeOfT, 0, (n - length) * sizeOfT);

  _length = n;
  return kErrorOk;
}